

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseBinaryExpression
          (Parser *this,ExpressionSyntax *left,
          bitmask<slang::parsing::detail::ExpressionOptions> options,int precedence)

{
  SyntaxFactory *this_00;
  uint uVar1;
  bool bVar2;
  SyntaxKind kind;
  int iVar3;
  DistConstraintListSyntax *distribution;
  SourceLocation location;
  Diagnostic *this_01;
  ConditionalPredicateSyntax *predicate;
  ExpressionSyntax *pEVar4;
  ExpressionSyntax *right;
  bitmask<slang::parsing::detail::ExpressionOptions> options_00;
  Token TVar5;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar6;
  SourceRange range;
  AttrList AVar7;
  bitmask<slang::parsing::detail::ExpressionOptions> local_d8;
  byte local_b8;
  char local_b4;
  Token local_98;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_88;
  Token local_50;
  Token question;
  
  Token::Token(&local_98);
  local_d8.m_bits = options.m_bits & 0x1fd;
  this_00 = &this->factory;
  local_b8 = (byte)(options.m_bits >> 8) & 1;
  options_00.m_bits = options.m_bits;
  do {
    local_98 = ParserBase::peek(&this->super_ParserBase);
    kind = slang::syntax::SyntaxFacts::getBinaryExpression(local_98.kind);
    if (kind == LogicalAndExpression) {
LAB_003503dc:
      uVar1 = options_00.m_bits & 0x40;
joined_r0x003503eb:
      if (uVar1 != 0) goto LAB_0035058a;
    }
    else {
      if (kind == LogicalImplicationExpression) {
        uVar1 = options_00.m_bits & 4;
        goto joined_r0x003503eb;
      }
      if (kind == LogicalOrExpression) goto LAB_003503dc;
      if (kind == Unknown) {
LAB_0035058a:
        iVar3 = slang::syntax::SyntaxFacts::getPrecedence(LogicalOrExpression);
        if ((precedence < iVar3 && (options_00.m_bits & 1) == 0) &&
           ((local_98.kind == Question ||
            (((local_98.kind == MatchesKeyword || (local_98.kind == TripleAnd)) &&
             (bVar2 = isConditionalExpression(this), bVar2)))))) {
          Token::Token(&question);
          predicate = parseConditionalPredicate(this,left,Question,&question);
          AVar7 = parseAttributes(this);
          if ((options_00.m_bits >> 8 & 1) != 0) {
            errorIfAttributes(this,AVar7);
          }
          pEVar4 = parseSubExpression(this,options_00,iVar3 + -1);
          TVar5 = ParserBase::expect(&this->super_ParserBase,Colon);
          right = parseSubExpression(this,options_00,iVar3 + -1);
          local_88.super_SyntaxListBase.super_SyntaxNode.kind = 1;
          local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
          local_88.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
          local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00593670;
          local_88.super_SyntaxListBase.childCount = AVar7._M_extent._M_extent_value._M_extent_value
          ;
          local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> =
               AVar7;
          local_50 = TVar5;
          left = &slang::syntax::SyntaxFactory::conditionalExpression
                            (this_00,predicate,question,&local_88,pEVar4,TVar5,right)->
                  super_ExpressionSyntax;
        }
        return &((ConditionalExpressionSyntax *)left)->super_ExpressionSyntax;
      }
      if (kind == MultiplyExpression) {
        TVar5 = ParserBase::peek(&this->super_ParserBase,1);
        if (TVar5.kind == CloseParenthesis) {
          local_88.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase,1);
          sVar6 = Token::trivia((Token *)&local_88);
          kind = MultiplyExpression;
          if (sVar6._M_extent._M_extent_value._M_extent_value == 0) goto LAB_0035058a;
        }
      }
      else if ((kind == LessThanEqualExpression) &&
              (kind = NonblockingAssignmentExpression, (options_00.m_bits & 2) == 0)) {
        kind = LessThanEqualExpression;
      }
    }
    iVar3 = slang::syntax::SyntaxFacts::getPrecedence(kind);
    options_00.m_bits = local_d8.m_bits;
    if ((iVar3 < precedence) ||
       ((iVar3 == precedence &&
        (bVar2 = slang::syntax::SyntaxFacts::isRightAssociative(kind), !bVar2)))) goto LAB_0035058a;
    if (kind == ExpressionOrDist) {
      distribution = parseDistConstraintList(this);
      left = &slang::syntax::SyntaxFactory::expressionOrDist(this_00,left,distribution)->
              super_ExpressionSyntax;
      local_b4 = (char)options.m_bits;
      if (-1 < local_b4) {
        location = Token::location(&distribution->dist);
        this_01 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x6b0005,location);
        range = slang::syntax::SyntaxNode::sourceRange(&distribution->super_SyntaxNode);
        Diagnostic::operator<<(this_01,range);
      }
    }
    else if (kind == InsideExpression) {
      left = parseInsideExpression(this,left);
    }
    else {
      TVar5 = ParserBase::consume(&this->super_ParserBase);
      AVar7 = parseAttributes(this);
      pEVar4 = parseSubExpression(this,local_d8,iVar3);
      local_88.super_SyntaxListBase.super_SyntaxNode.kind = 1;
      local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_88.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00593670;
      local_88.super_SyntaxListBase.childCount = AVar7._M_extent._M_extent_value._M_extent_value;
      local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> = AVar7;
      left = &slang::syntax::SyntaxFactory::binaryExpression
                        (this_00,kind,left,TVar5,&local_88,pEVar4)->super_ExpressionSyntax;
      bVar2 = slang::syntax::SyntaxFacts::isAssignmentOperator(kind);
      if ((bVar2 | local_b8) == 1) {
        errorIfAttributes(this,AVar7);
      }
    }
  } while( true );
}

Assistant:

ExpressionSyntax& Parser::parseBinaryExpression(ExpressionSyntax* left,
                                                bitmask<ExpressionOptions> options,
                                                int precedence) {
    Token current;
    while (true) {
        // either a binary operator, or we're done
        current = peek();
        auto opKind = getBinaryExpression(current.kind);
        if (opKind == SyntaxKind::Unknown) {
            break;
        }
        else if (opKind == SyntaxKind::LogicalImplicationExpression &&
                 options.has(ExpressionOptions::ConstraintContext)) {
            // the implication operator in constraint blocks is special, we don't handle it here
            break;
        }
        else if ((opKind == SyntaxKind::LogicalAndExpression ||
                  opKind == SyntaxKind::LogicalOrExpression) &&
                 options.has(ExpressionOptions::BinsSelectContext)) {
            // The && and || operators in a bins select expression are part of the bins select
            // and not part of this nested sub expression.
            break;
        }
        else if (opKind == SyntaxKind::MultiplyExpression &&
                 peek(1).kind == TokenKind::CloseParenthesis && peek(1).trivia().empty()) {
            // This is an end-of-attribute token, not a multiply.
            break;
        }
        else if (opKind == SyntaxKind::LessThanEqualExpression &&
                 options.has(ExpressionOptions::ProceduralAssignmentContext)) {
            // we have to special case '<=', which can be less than or nonblocking assignment
            // depending
            // on context
            opKind = SyntaxKind::NonblockingAssignmentExpression;
        }

        options &= ~ExpressionOptions::ProceduralAssignmentContext;

        // see if we should take this operator or if it's part of our parent due to precedence
        int newPrecedence = getPrecedence(opKind);
        if (newPrecedence < precedence)
            break;

        // if we have a precedence tie, check associativity
        if (newPrecedence == precedence && !isRightAssociative(opKind))
            break;

        // take the operator
        if (opKind == SyntaxKind::InsideExpression) {
            left = &parseInsideExpression(*left);
        }
        else if (opKind == SyntaxKind::ExpressionOrDist) {
            auto& dist = parseDistConstraintList();
            left = &factory.expressionOrDist(*left, dist);

            if (!options.has(ExpressionOptions::AllowDist)) {
                addDiag(diag::InvalidDistExpression, dist.dist.location()) << dist.sourceRange();
            }
        }
        else {
            auto opToken = consume();
            auto attributes = parseAttributes();
            auto& rightOperand = parseSubExpression(options, newPrecedence);
            left = &factory.binaryExpression(opKind, *left, opToken, attributes, rightOperand);

            if (isAssignmentOperator(opKind) || options.has(ExpressionOptions::DisallowAttrs))
                errorIfAttributes(attributes);
        }
    }

    // Handle conditional expressions (and their optional pattern matched predicate).
    // Only do this if we're not already within a conditional pattern context, and if
    // we're at the right precedence level (one lower than a logical-or) to take it.
    int logicalOrPrecedence = getPrecedence(SyntaxKind::LogicalOrExpression);
    if (!options.has(ExpressionOptions::PatternContext) && precedence < logicalOrPrecedence) {
        // If this is the start of a pattern predicate, check whether there's actually a
        // question mark coming up. Otherwise we might be a predicate inside a
        // statement which doesn't need the question.
        bool takeConditional = current.kind == TokenKind::Question;
        if (current.kind == TokenKind::MatchesKeyword || current.kind == TokenKind::TripleAnd)
            takeConditional = isConditionalExpression();

        if (takeConditional) {
            Token question;
            auto& predicate = parseConditionalPredicate(*left, TokenKind::Question, question);
            auto attributes = parseAttributes();
            if (options.has(ExpressionOptions::DisallowAttrs))
                errorIfAttributes(attributes);

            auto& lhs = parseSubExpression(options, logicalOrPrecedence - 1);
            auto colon = expect(TokenKind::Colon);
            auto& rhs = parseSubExpression(options, logicalOrPrecedence - 1);
            left = &factory.conditionalExpression(predicate, question, attributes, lhs, colon, rhs);
        }
    }

    return *left;
}